

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O1

bool __thiscall libwebm::PesHeader::Write(PesHeader *this,bool write_pts,PacketDataBuffer *buffer)

{
  pointer *ppuVar1;
  iterator iVar2;
  bool bVar3;
  undefined8 in_RAX;
  uchar uVar4;
  int i;
  long lVar5;
  uint8_t byte;
  undefined8 uStack_28;
  
  if (buffer == (PacketDataBuffer *)0x0) {
    Write();
  }
  else {
    lVar5 = 0;
    uStack_28 = in_RAX;
    do {
      iVar2._M_current =
           (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)buffer,iVar2,
                   this->start_code + lVar5);
      }
      else {
        *iVar2._M_current = this->start_code[lVar5];
        ppuVar1 = &(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if ((ulong)this->packet_length < 0xfff7) {
      lVar5 = (ulong)this->packet_length + 9;
      uVar4 = (uchar)((ulong)lVar5 >> 8);
      uStack_28 = CONCAT17(uVar4,(undefined7)uStack_28);
      iVar2._M_current =
           (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)buffer,iVar2,
                   (uchar *)((long)&uStack_28 + 7));
      }
      else {
        *iVar2._M_current = uVar4;
        ppuVar1 = &(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar4 = (uchar)lVar5;
      uStack_28 = CONCAT17(uVar4,(undefined7)uStack_28);
      iVar2._M_current =
           (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)buffer,iVar2,
                   (uchar *)((long)&uStack_28 + 7));
      }
      else {
        *iVar2._M_current = uVar4;
        ppuVar1 = &(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      bVar3 = PesOptionalHeader::Write(&this->optional_header,write_pts,buffer);
      if (bVar3) {
        return bVar3;
      }
      Write();
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool PesHeader::Write(bool write_pts, PacketDataBuffer* buffer) const {
  if (buffer == nullptr) {
    std::fprintf(stderr, "Webm2Pes: nullptr in header writer.\n");
    return false;
  }

  // Write |start_code|.
  const int kStartCodeLength = 4;
  for (int i = 0; i < kStartCodeLength; ++i)
    buffer->push_back(start_code[i]);

  // The length field here reports number of bytes following the field. The
  // length of the optional header must be added to the payload length set by
  // the user.
  const std::size_t header_length =
      packet_length + optional_header.size_in_bytes();
  if (header_length > UINT16_MAX)
    return false;

  // Write |header_length| as big endian.
  std::uint8_t byte = (header_length >> 8) & 0xff;
  buffer->push_back(byte);
  byte = header_length & 0xff;
  buffer->push_back(byte);

  // Write the (not really) optional header.
  if (optional_header.Write(write_pts, buffer) != true) {
    std::fprintf(stderr, "Webm2Pes: PES optional header write failed.");
    return false;
  }
  return true;
}